

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::testRunEnded(XmlReporter *this,TestRunStats *testRunStats)

{
  XmlFormatting fmt;
  ScopedElement *pSVar1;
  allocator local_181;
  string local_180;
  allocator local_159;
  string local_158;
  allocator local_131;
  string local_130;
  allocator local_109;
  string local_108 [32];
  undefined1 local_e8 [24];
  string local_d0;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48 [32];
  undefined1 local_28 [24];
  TestRunStats *testRunStats_local;
  XmlReporter *this_local;
  
  local_28._16_8_ = testRunStats;
  testRunStats_local = (TestRunStats *)this;
  StreamingReporterBase<Catch::XmlReporter>::testRunEnded
            (&this->super_StreamingReporterBase<Catch::XmlReporter>,testRunStats);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"OverallResults",&local_49);
  Catch::operator|(Newline,Indent);
  XmlWriter::scopedElement((XmlWriter *)local_28,(string *)&this->m_xml,(XmlFormatting)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"successes",&local_81);
  pSVar1 = XmlWriter::ScopedElement::writeAttribute<unsigned_long>
                     ((ScopedElement *)local_28,&local_80,
                      &(((Totals *)(local_28._16_8_ + 0x28))->assertions).passed);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"failures",&local_a9);
  pSVar1 = XmlWriter::ScopedElement::writeAttribute<unsigned_long>
                     (pSVar1,&local_a8,&(((Totals *)(local_28._16_8_ + 0x28))->assertions).failed);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d0,"expectedFailures",(allocator *)(local_e8 + 0x17));
  XmlWriter::ScopedElement::writeAttribute<unsigned_long>
            (pSVar1,&local_d0,&(((Totals *)(local_28._16_8_ + 0x28))->assertions).failedButOk);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)(local_e8 + 0x17));
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_28);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"OverallResultsCases",&local_109);
  Catch::operator|(Newline,Indent);
  XmlWriter::scopedElement((XmlWriter *)local_e8,(string *)&this->m_xml,(XmlFormatting)local_108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"successes",&local_131);
  pSVar1 = XmlWriter::ScopedElement::writeAttribute<unsigned_long>
                     ((ScopedElement *)local_e8,&local_130,
                      &(((Totals *)(local_28._16_8_ + 0x28))->testCases).passed);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"failures",&local_159);
  pSVar1 = XmlWriter::ScopedElement::writeAttribute<unsigned_long>
                     (pSVar1,&local_158,&(((Totals *)(local_28._16_8_ + 0x28))->testCases).failed);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_180,"expectedFailures",&local_181);
  XmlWriter::ScopedElement::writeAttribute<unsigned_long>
            (pSVar1,&local_180,&(((Totals *)(local_28._16_8_ + 0x28))->testCases).failedButOk);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_e8);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  fmt = Catch::operator|(Newline,Indent);
  XmlWriter::endElement(&this->m_xml,fmt);
  return;
}

Assistant:

void XmlReporter::testRunEnded( TestRunStats const& testRunStats ) {
        StreamingReporterBase::testRunEnded( testRunStats );
        m_xml.scopedElement( "OverallResults" )
            .writeAttribute( "successes", testRunStats.totals.assertions.passed )
            .writeAttribute( "failures", testRunStats.totals.assertions.failed )
            .writeAttribute( "expectedFailures", testRunStats.totals.assertions.failedButOk );
        m_xml.scopedElement( "OverallResultsCases")
            .writeAttribute( "successes", testRunStats.totals.testCases.passed )
            .writeAttribute( "failures", testRunStats.totals.testCases.failed )
            .writeAttribute( "expectedFailures", testRunStats.totals.testCases.failedButOk );
        m_xml.endElement();
    }